

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

void __thiscall phyr::Transform::Transform(Transform *this)

{
  _Mat4x4 *in_RDI;
  
  _Mat4x4::_Mat4x4(in_RDI);
  _Mat4x4::_Mat4x4(in_RDI + 1);
  return;
}

Assistant:

Transform() {}